

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_b9def::accumulator<std::basic_ostream<char,_std::char_traits<char>_>_>::push_back
          (accumulator<std::basic_ostream<char,_std::char_traits<char>_>_> *this,char c)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  
  if (this->width_ == 0) {
    std::__cxx11::string::append((string *)&this->lines_);
  }
  pbVar1 = &this->lines_;
  std::__cxx11::string::push_back((char)pbVar1);
  uVar2 = this->width_ + 1;
  this->width_ = uVar2;
  if (0x4f < uVar2) {
    std::__cxx11::string::push_back((char)pbVar1);
    this->width_ = 0;
    uVar2 = this->line_count_ + 1;
    this->line_count_ = uVar2;
    if (0x31 < uVar2) {
      std::operator<<(this->os_,(string *)pbVar1);
      this->line_count_ = 0;
      (this->lines_)._M_string_length = 0;
      *(this->lines_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::reserve((ulong)pbVar1);
      return;
    }
  }
  return;
}

Assistant:

void accumulator<OStream>::push_back (char const c) {
        if (width_ == 0) {
            lines_ += indent_string_;
        }
        lines_ += c;
        if (++width_ >= line_width_) {
            lines_ += '\n';
            width_ = 0;
            if (++line_count_ >= lines_to_accumulate_) {
                os_ << lines_;
                line_count_ = 0;

                lines_.clear ();
                lines_.reserve (chars_to_reserve_);
            }
        }
    }